

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-whisper.cpp
# Opt level: O3

bool speak_with_file(string *command,string *text,string *path,int voice_id)

{
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  bool bVar9;
  uint __val;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ofstream speak_file;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0 [2];
  long *local_2b0;
  undefined8 local_2a8;
  long local_2a0;
  undefined8 uStack_298;
  ulong *local_290;
  long local_288;
  ulong local_280 [2];
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(path->_M_dataplus)._M_p,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    std::ostream::write((char *)&local_230,(long)(text->_M_dataplus)._M_p);
    std::ofstream::close();
    pcVar1 = (command->_M_dataplus)._M_p;
    local_2d0 = local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d0,pcVar1,pcVar1 + command->_M_string_length);
    std::__cxx11::string::append((char *)&local_2d0);
    __val = -voice_id;
    if (0 < voice_id) {
      __val = voice_id;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar6 = (uint)uVar8;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_0017c7eb;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_0017c7eb;
        }
        if (uVar6 < 10000) goto LAB_0017c7eb;
        uVar8 = uVar8 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_0017c7eb:
    local_290 = local_280;
    std::__cxx11::string::_M_construct((ulong)&local_290,(char)__len - (char)(voice_id >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)voice_id >> 0x1f) + (long)local_290),__len,__val);
    uVar8 = 0xf;
    if (local_2d0 != local_2c0) {
      uVar8 = local_2c0[0];
    }
    if (uVar8 < (ulong)(local_288 + local_2c8)) {
      uVar8 = 0xf;
      if (local_290 != local_280) {
        uVar8 = local_280[0];
      }
      if (uVar8 < (ulong)(local_288 + local_2c8)) goto LAB_0017c85d;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_0017c85d:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290);
    }
    local_2b0 = &local_2a0;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_2a0 = *plVar5;
      uStack_298 = puVar4[3];
    }
    else {
      local_2a0 = *plVar5;
      local_2b0 = (long *)*puVar4;
    }
    local_2a8 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_260 = *plVar7;
      lStack_258 = plVar5[3];
      local_270 = &local_260;
    }
    else {
      local_260 = *plVar7;
      local_270 = (long *)*plVar5;
    }
    local_268 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_270,(ulong)(path->_M_dataplus)._M_p);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_240 = *plVar7;
      lStack_238 = plVar5[3];
      local_250 = &local_240;
    }
    else {
      local_240 = *plVar7;
      local_250 = (long *)*plVar5;
    }
    local_248 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    iVar3 = system((char *)local_250);
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,local_260 + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,local_2a0 + 1);
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
    if (local_2d0 != local_2c0) {
      operator_delete(local_2d0,local_2c0[0] + 1);
    }
    bVar9 = true;
    if (iVar3 == 0) goto LAB_0017ca05;
  }
  speak_with_file();
  bVar9 = false;
LAB_0017ca05:
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return bVar9;
}

Assistant:

bool speak_with_file(const std::string & command, const std::string & text, const std::string & path, int voice_id) {
    std::ofstream speak_file(path.c_str());
    if (speak_file.fail()) {
        fprintf(stderr, "%s: failed to open speak_file\n", __func__);
        return false;
    } else {
        speak_file.write(text.c_str(), text.size());
        speak_file.close();
        int ret = system((command + " " + std::to_string(voice_id) + " " + path).c_str());
        if (ret != 0) {
            fprintf(stderr, "%s: failed to speak\n", __func__);
            return false;
        }
    }
    return true;
}